

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

bool __thiscall QDtls::setPeerVerificationName(QDtls *this,QString *name)

{
  int iVar1;
  pointer s;
  pointer pDVar2;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  DtlsCryptograph *backend;
  QDtlsPrivate *d;
  int in_stack_ffffffffffffff9c;
  char *c;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDtls *)0x3b9e9a);
  s = std::
      unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>::
      get((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
           *)0x3b9ead);
  if (s == (pointer)0x0) {
    local_21 = false;
  }
  else {
    iVar1 = (**(code **)(*(long *)s + 0x90))();
    if (iVar1 == 0) {
      (**(code **)(*(long *)(s + *(long *)(*(long *)s + -0x60)) + 0x28))
                (s + *(long *)(*(long *)s + -0x60));
      (**(code **)(*(long *)s + 0x70))(s,in_RSI);
      local_21 = true;
    }
    else {
      c = *(char **)(*(long *)s + -0x60);
      pDVar2 = s + (long)c;
      tr((char *)s,c,in_stack_ffffffffffffff9c);
      (**(code **)(*(long *)(s + (long)c) + 0x10))(pDVar2,2,local_20);
      QString::~QString((QString *)0x3b9f39);
      local_21 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::setPeerVerificationName(const QString &name)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (backend->state() != HandshakeNotStarted) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                        tr("Cannot set verification name after handshake started"));
        return false;
    }

    backend->clearDtlsError();
    backend->setPeerVerificationName(name);

    return true;
}